

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-decompile.cc
# Opt level: O2

int ProgramMain(int argc,char **argv)

{
  undefined8 uVar1;
  _Alloc_hider this;
  Result RVar2;
  char *pcVar3;
  string *callback;
  ReadBinaryOptions *options_00;
  int iVar4;
  string_view filename;
  string_view filename_00;
  bool fail_on_custom_section_error;
  DecompileOptions decompile_options;
  Features features;
  ReadBinaryOptions options;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  string outfile;
  string infile;
  Errors errors;
  string s;
  OptionParser parser;
  char s_description [208];
  
  wabt::InitStdio();
  infile._M_dataplus._M_p = (pointer)&infile.field_2;
  infile._M_string_length = 0;
  infile.field_2._M_local_buf[0] = '\0';
  outfile._M_dataplus._M_p = (pointer)&outfile.field_2;
  outfile._M_string_length = 0;
  outfile.field_2._M_local_buf[0] = '\0';
  features.exceptions_enabled_ = false;
  features.mutable_globals_enabled_ = true;
  features.sat_float_to_int_enabled_ = false;
  features.sign_extension_enabled_ = false;
  features.simd_enabled_ = false;
  features.threads_enabled_ = false;
  features.multi_value_enabled_ = false;
  features.tail_call_enabled_ = false;
  features.bulk_memory_enabled_ = false;
  features.reference_types_enabled_ = false;
  features.annotations_enabled_ = false;
  features.gc_enabled_ = false;
  fail_on_custom_section_error = true;
  memcpy(s_description,
         "  Read a file in the WebAssembly binary format, and convert it to\n  a decompiled text file.\n\nexamples:\n  # parse binary file test.wasm and write text file test.dcmp\n  $ wasm-decompile test.wasm -o test.dcmp\n"
         ,0xd0);
  wabt::OptionParser::OptionParser(&parser,"wasm-decompile",s_description);
  options.features.bulk_memory_enabled_ = false;
  options.features.reference_types_enabled_ = false;
  options.features.annotations_enabled_ = false;
  options.features.gc_enabled_ = false;
  options._12_4_ = 0;
  options.features._0_8_ = &outfile;
  options._24_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm-decompile.cc:58:9)>
       ::_M_invoke;
  options.log_stream =
       (Stream *)
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm-decompile.cc:58:9)>
       ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'o',"output","FILENAME",
             "Output file for the decompiled file, by default use stdout",(Callback *)&options);
  if (options.log_stream != (Stream *)0x0) {
    (*(code *)options.log_stream)(&options,&options,3);
  }
  wabt::Features::AddOptions(&features,&parser);
  options.features.bulk_memory_enabled_ = false;
  options.features.reference_types_enabled_ = false;
  options.features.annotations_enabled_ = false;
  options.features.gc_enabled_ = false;
  options._12_4_ = 0;
  options.features._0_8_ = &fail_on_custom_section_error;
  options._24_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm-decompile.cc:65:22)>
       ::_M_invoke;
  options.log_stream =
       (Stream *)
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm-decompile.cc:65:22)>
       ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,"ignore-custom-section-errors","Ignore errors in custom sections",
             (NullCallback *)&options);
  if (options.log_stream != (Stream *)0x0) {
    (*(code *)options.log_stream)(&options,&options,3);
  }
  std::__cxx11::string::string((string *)&options,"filename",(allocator *)&file_data);
  callback = &s;
  s._M_string_length = 0;
  s._M_dataplus._M_p = (pointer)&infile;
  s.field_2._8_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm-decompile.cc:67:24)>
       ::_M_invoke;
  s.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm-decompile.cc:67:24)>
       ::_M_manager;
  wabt::OptionParser::AddArgument(&parser,(string *)&options,One,(Callback *)callback);
  if (s.field_2._M_allocated_capacity != 0) {
    (*(code *)s.field_2._M_allocated_capacity)(&s,&s,3);
  }
  std::__cxx11::string::_M_dispose();
  wabt::OptionParser::Parse(&parser,argc,argv);
  wabt::OptionParser::~OptionParser(&parser);
  this = infile._M_dataplus;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar3 = (char *)strlen(infile._M_dataplus._M_p);
  filename.size_ = (size_type)&file_data;
  filename.data_ = pcVar3;
  RVar2 = wabt::ReadFile((wabt *)this._M_p,filename,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)callback);
  if (RVar2.enum_ == Ok) {
    errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    wabt::Module::Module((Module *)s_description);
    uVar1 = options._8_8_;
    options.features.sat_float_to_int_enabled_ = features.sat_float_to_int_enabled_;
    options.features.sign_extension_enabled_ = features.sign_extension_enabled_;
    options.features.simd_enabled_ = features.simd_enabled_;
    options.features.threads_enabled_ = features.threads_enabled_;
    options.features.multi_value_enabled_ = features.multi_value_enabled_;
    options.features.tail_call_enabled_ = features.tail_call_enabled_;
    options.features.exceptions_enabled_ = features.exceptions_enabled_;
    options.features.mutable_globals_enabled_ = features.mutable_globals_enabled_;
    options_00 = &options;
    options.features.annotations_enabled_ = features.annotations_enabled_;
    options.features.gc_enabled_ = features.gc_enabled_;
    options.features.bulk_memory_enabled_ = features.bulk_memory_enabled_;
    options.features.reference_types_enabled_ = features.reference_types_enabled_;
    options._12_4_ = SUB84(uVar1,4);
    options.log_stream = (Stream *)0x0;
    options.fail_on_custom_section_error = fail_on_custom_section_error;
    options.read_debug_names = true;
    options.stop_on_first_error = true;
    RVar2 = wabt::ReadBinaryIr(infile._M_dataplus._M_p,
                               file_data.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)file_data.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)file_data.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,options_00,&errors,
                               (Module *)s_description);
    if (RVar2.enum_ == Ok) {
      parser.program_name_._M_string_length =
           CONCAT44(parser.program_name_._M_string_length._4_4_,
                    CONCAT22(features._10_2_,features._8_2_));
      parser.program_name_._M_dataplus._M_p = (pointer)CONCAT62(features._2_6_,features._0_2_);
      wabt::ValidateModule((Module *)s_description,&errors,(ValidateOptions *)&parser);
      iVar4 = 1;
      RVar2 = wabt::GenerateNames((Module *)s_description,AlphaNames);
      wabt::RenameAll((Module *)s_description);
      if (RVar2.enum_ == Ok) {
        wabt::ApplyNames((Module *)s_description);
        wabt::Decompile_abi_cxx11_
                  (&s,(wabt *)s_description,(Module *)&decompile_options,
                   (DecompileOptions *)options_00);
        if (outfile._M_string_length == 0) {
          wabt::FileStream::FileStream((FileStream *)&parser,_stdout,(Stream *)0x0);
        }
        else {
          filename_00.size_ = outfile._M_string_length;
          filename_00.data_ = outfile._M_dataplus._M_p;
          wabt::FileStream::FileStream((FileStream *)&parser,filename_00,(Stream *)0x0);
        }
        iVar4 = 0;
        wabt::Stream::WriteData
                  ((Stream *)&parser,s._M_dataplus._M_p,s._M_string_length,(char *)0x0,No);
        wabt::FileStream::~FileStream((FileStream *)&parser);
        std::__cxx11::string::_M_dispose();
      }
    }
    else {
      iVar4 = 1;
    }
    parser.program_name_._M_dataplus._M_p = (pointer)&parser.program_name_.field_2;
    parser.program_name_._M_string_length = 0;
    parser.program_name_.field_2._M_local_buf[0] = '\0';
    wabt::FormatErrorsToFile
              (&errors,Binary,(LexerSourceLineFinder *)0x0,_stderr,&parser.program_name_,Never,0x50)
    ;
    std::__cxx11::string::_M_dispose();
    wabt::Module::~Module((Module *)s_description);
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&errors);
  }
  else {
    iVar4 = 1;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return iVar4;
}

Assistant:

int ProgramMain(int argc, char** argv) {
  InitStdio();

  std::string infile;
  std::string outfile;
  Features features;
  DecompileOptions decompile_options;
  bool fail_on_custom_section_error = true;

  {
    const char s_description[] =
      "  Read a file in the WebAssembly binary format, and convert it to\n"
      "  a decompiled text file.\n"
      "\n"
      "examples:\n"
      "  # parse binary file test.wasm and write text file test.dcmp\n"
      "  $ wasm-decompile test.wasm -o test.dcmp\n";
    OptionParser parser("wasm-decompile", s_description);
    parser.AddOption(
        'o', "output", "FILENAME",
        "Output file for the decompiled file, by default use stdout",
        [&](const char* argument) {
          outfile = argument;
          ConvertBackslashToSlash(&outfile);
        });
    features.AddOptions(&parser);
    parser.AddOption("ignore-custom-section-errors",
                     "Ignore errors in custom sections",
                     [&]() { fail_on_custom_section_error = false; });
    parser.AddArgument("filename", OptionParser::ArgumentCount::One,
                       [&](const char* argument) {
                         infile = argument;
                         ConvertBackslashToSlash(&infile);
                       });
    parser.Parse(argc, argv);
  }

  std::vector<uint8_t> file_data;
  Result result = ReadFile(infile.c_str(), &file_data);
  if (Succeeded(result)) {
    Errors errors;
    Module module;
    const bool kStopOnFirstError = true;
    ReadBinaryOptions options(features, nullptr,
                              true, kStopOnFirstError,
                              fail_on_custom_section_error);
    result = ReadBinaryIr(infile.c_str(), file_data.data(), file_data.size(),
                          options, &errors, &module);
    if (Succeeded(result)) {
      if (Succeeded(result)) {
        ValidateOptions options(features);
        result = ValidateModule(&module, &errors, options);
      }
      result = GenerateNames(&module,
                             static_cast<NameOpts>(NameOpts::AlphaNames));
      // Must be called after ReadBinaryIr & GenerateNames, and before
      // ApplyNames, see comments at definition.
      RenameAll(module);
      if (Succeeded(result)) {
        /* TODO(binji): This shouldn't fail; if a name can't be applied
         * (because the index is invalid, say) it should just be skipped. */
        Result dummy_result = ApplyNames(&module);
        WABT_USE(dummy_result);
      }
      if (Succeeded(result)) {
        auto s = Decompile(module, decompile_options);
        FileStream stream(!outfile.empty() ? FileStream(outfile)
                                             : FileStream(stdout));
        stream.WriteData(s.data(), s.size());
      }
    }
    FormatErrorsToFile(errors, Location::Type::Binary);
  }
  return result != Result::Ok;
}